

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSRuntime * JS_NewRuntime2(JSMallocFunctions *mf,void *opaque)

{
  int iVar1;
  JSRuntime *tab;
  JSRuntime *in_RSI;
  JSRuntime *in_RDI;
  JSMallocState ms;
  JSRuntime *rt;
  JSRuntime *in_stack_ffffffffffffffa8;
  uint uStack_4c;
  JSRuntime *in_stack_ffffffffffffffb8;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  JSRuntime *rt_00;
  
  memset(&local_40,0,0x20);
  local_30 = 0xffffffffffffffff;
  rt_00 = in_RSI;
  tab = (JSRuntime *)(*(in_RDI->mf).js_malloc)((JSMallocState *)&local_40,400);
  if (tab != (JSRuntime *)0x0) {
    memset(tab,0,400);
    (tab->mf).js_malloc = (in_RDI->mf).js_malloc;
    (tab->mf).js_free = (in_RDI->mf).js_free;
    (tab->mf).js_realloc = (in_RDI->mf).js_realloc;
    (tab->mf).js_malloc_usable_size = (in_RDI->mf).js_malloc_usable_size;
    if ((tab->mf).js_malloc_usable_size == (_func_size_t_void_ptr *)0x0) {
      (tab->mf).js_malloc_usable_size = js_malloc_usable_size_unknown;
    }
    (tab->malloc_state).malloc_count = local_40;
    (tab->malloc_state).malloc_size = local_38;
    (tab->malloc_state).malloc_limit = local_30;
    (tab->malloc_state).opaque = in_RSI;
    tab->malloc_gc_threshold = 0x40000;
    init_list_head(&tab->context_list);
    init_list_head(&tab->gc_obj_list);
    init_list_head(&tab->gc_zero_ref_count_list);
    tab->field_0xb8 = 0;
    init_list_head(&tab->job_list);
    iVar1 = JS_InitAtoms(in_stack_ffffffffffffffb8);
    if ((iVar1 == 0) &&
       (iVar1 = init_class_range(rt_00,(JSClassShortDef *)tab,(int)((ulong)in_RSI >> 0x20),
                                 (int)in_RSI), -1 < iVar1)) {
      tab->class_array[8].exotic = &js_arguments_exotic_methods;
      tab->class_array[5].exotic = &js_string_exotic_methods;
      tab->class_array[0xb].exotic = &js_module_ns_exotic_methods;
      tab->class_array[0xc].call = js_call_c_function;
      tab->class_array[0xf].call = js_c_function_data_call;
      tab->class_array[0xe].call = js_call_bound_function;
      tab->class_array[0x10].call = js_generator_function_call;
      iVar1 = init_shape_hash(in_stack_ffffffffffffffa8);
      if (iVar1 == 0) {
        tab->stack_size = 0x40000;
        JS_UpdateStackTop((JSRuntime *)0x11c43e);
        (tab->current_exception).u.ptr = (void *)((ulong)uStack_4c << 0x20);
        (tab->current_exception).tag = 2;
        return tab;
      }
    }
    JS_FreeRuntime(in_RDI);
  }
  return (JSRuntime *)0x0;
}

Assistant:

JSRuntime *JS_NewRuntime2(const JSMallocFunctions *mf, void *opaque)
{
    JSRuntime *rt;
    JSMallocState ms;

    memset(&ms, 0, sizeof(ms));
    ms.opaque = opaque;
    ms.malloc_limit = -1;

    rt = mf->js_malloc(&ms, sizeof(JSRuntime));
    if (!rt)
        return NULL;
    memset(rt, 0, sizeof(*rt));
    rt->mf = *mf;
    if (!rt->mf.js_malloc_usable_size) {
        /* use dummy function if none provided */
        rt->mf.js_malloc_usable_size = js_malloc_usable_size_unknown;
    }
    rt->malloc_state = ms;
    rt->malloc_gc_threshold = 256 * 1024;

#ifdef CONFIG_BIGNUM
    bf_context_init(&rt->bf_ctx, js_bf_realloc, rt);
    set_dummy_numeric_ops(&rt->bigint_ops);
    set_dummy_numeric_ops(&rt->bigfloat_ops);
    set_dummy_numeric_ops(&rt->bigdecimal_ops);
#endif

    init_list_head(&rt->context_list);
    init_list_head(&rt->gc_obj_list);
    init_list_head(&rt->gc_zero_ref_count_list);
    rt->gc_phase = JS_GC_PHASE_NONE;
    
#ifdef DUMP_LEAKS
    init_list_head(&rt->string_list);
#endif
    init_list_head(&rt->job_list);

    if (JS_InitAtoms(rt))
        goto fail;

    /* create the object, array and function classes */
    if (init_class_range(rt, js_std_class_def, JS_CLASS_OBJECT,
                         countof(js_std_class_def)) < 0)
        goto fail;
    rt->class_array[JS_CLASS_ARGUMENTS].exotic = &js_arguments_exotic_methods;
    rt->class_array[JS_CLASS_STRING].exotic = &js_string_exotic_methods;
    rt->class_array[JS_CLASS_MODULE_NS].exotic = &js_module_ns_exotic_methods;

    rt->class_array[JS_CLASS_C_FUNCTION].call = js_call_c_function;
    rt->class_array[JS_CLASS_C_FUNCTION_DATA].call = js_c_function_data_call;
    rt->class_array[JS_CLASS_BOUND_FUNCTION].call = js_call_bound_function;
    rt->class_array[JS_CLASS_GENERATOR_FUNCTION].call = js_generator_function_call;
    if (init_shape_hash(rt))
        goto fail;

    rt->stack_size = JS_DEFAULT_STACK_SIZE;
    JS_UpdateStackTop(rt);

    rt->current_exception = JS_NULL;

    return rt;
 fail:
    JS_FreeRuntime(rt);
    return NULL;
}